

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawget(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *io1;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2addr(L,idx);
  pTVar1 = L->top;
  pTVar3 = luaH_get((Table *)(pTVar3->value_).gc,L->top + -1);
  pTVar1[-1].value_ = pTVar3->value_;
  uVar2 = *(undefined4 *)&pTVar3->field_0xc;
  pTVar1[-1].tt_ = pTVar3->tt_;
  *(undefined4 *)&pTVar1[-1].field_0xc = uVar2;
  return L->top[-1].tt_ & 0xf;
}

Assistant:

LUA_API int lua_rawget (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setobj2s(L, L->top - 1, luaH_get(hvalue(t), L->top - 1));
  lua_unlock(L);
  return ttnov(L->top - 1);
}